

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

bool __thiscall PowerPos<0,_0,_0>::propagate_case_zero(PowerPos<0,_0,_0> *this)

{
  Reason r;
  Reason r_00;
  bool bVar1;
  int64_t iVar2;
  IntView<0> *in_RDI;
  Reason m_r_1;
  int64_t m_v_1;
  Reason m_r;
  int64_t m_v;
  IntView<0> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  Lit in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  Reason local_20;
  undefined8 local_18;
  
  iVar2 = IntView<0>::getMax(in_stack_ffffffffffffffb0);
  if (iVar2 == 0) {
    local_18 = 0;
    bVar1 = IntView<0>::setMaxNotR(in_stack_ffffffffffffffb0,(int64_t)in_RDI);
    if (bVar1) {
      Reason::Reason(&local_20,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        IntView<0>::getMaxLit(in_RDI);
        Reason::Reason((Reason *)CONCAT44(in_stack_ffffffffffffffbc.x,in_stack_ffffffffffffffb8),
                       (Lit)in_stack_ffffffffffffffc4);
      }
      r.field_0._a._4_4_ = in_stack_ffffffffffffffc4;
      r.field_0._a._0_4_ = in_stack_ffffffffffffffc0;
      bVar1 = IntView<0>::setMax((IntView<0> *)
                                 CONCAT44(in_stack_ffffffffffffffbc.x,in_stack_ffffffffffffffb8),
                                 (int64_t)in_stack_ffffffffffffffb0,r,SUB81((ulong)in_RDI >> 0x38,0)
                                );
      if (!bVar1) {
        return false;
      }
    }
  }
  iVar2 = IntView<0>::getMax(in_stack_ffffffffffffffb0);
  if ((iVar2 == 0) &&
     (bVar1 = IntView<0>::setMaxNotR(in_stack_ffffffffffffffb0,(int64_t)in_RDI), bVar1)) {
    Reason::Reason((Reason *)&stack0xffffffffffffffc0,(Clause *)0x0);
    if ((so.lazy & 1U) != 0) {
      in_stack_ffffffffffffffbc = IntView<0>::getMaxLit(in_RDI);
      Reason::Reason((Reason *)CONCAT44(in_stack_ffffffffffffffbc.x,in_stack_ffffffffffffffb8),
                     (Lit)in_stack_ffffffffffffffc4);
    }
    r_00.field_0._a._4_4_ = in_stack_ffffffffffffffc4;
    r_00.field_0._a._0_4_ = in_stack_ffffffffffffffc0;
    bVar1 = IntView<0>::setMax((IntView<0> *)
                               CONCAT44(in_stack_ffffffffffffffbc.x,in_stack_ffffffffffffffb8),
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),r_00,
                               SUB81((ulong)in_RDI >> 0x38,0));
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool propagate_case_zero() {
		// x -> z
		if (x.getMax() == 0) {
			setDom(z, setMax, 0, x.getMaxLit());
		}
		// z -> x
		if (z.getMax() == 0) {
			setDom(x, setMax, 0, z.getMaxLit());
		}
		return true;
	}